

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O3

bool __thiscall
glcts::(anonymous_namespace)::LoadStoreMachine::Write<tcu::Vector<float,4>>
          (LoadStoreMachine *this,GLenum internalformat,Vector<float,_4> *write_value,
          Vector<float,_4> *expected_value)

{
  CallLogWrapper *this_00;
  GLenum target;
  void *__s;
  int *piVar1;
  Vector<int,_4> *extraout_RDX;
  Vector<int,_4> *extraout_RDX_00;
  Vector<int,_4> *extraout_RDX_01;
  Vector<int,_4> *v;
  ulong uVar2;
  int i;
  long lVar3;
  Vector<float,_4> *in_R8;
  Vector<float,_4> *expected_value_00;
  GLenum *pGVar4;
  bool bVar5;
  GLuint local_90;
  GLuint local_8c;
  string local_88;
  GLuint textures [4];
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  if (*(int *)(this + 0x30) == 4) {
    GenStoreShader<tcu::Vector<float,4>>
              (&local_88,(LoadStoreMachine *)&DAT_00000004,internalformat,(GLenum)write_value,in_R8)
    ;
    local_8c = glcts::anon_unknown_0::ShaderImageLoadStoreBase::CreateComputeProgram
                         ((ShaderImageLoadStoreBase *)this,&local_88,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    GenLoadShader<tcu::Vector<float,4>>
              (&local_88,(LoadStoreMachine *)(ulong)*(uint *)(this + 0x30),internalformat,
               (GLenum)expected_value,in_R8);
    local_90 = glcts::anon_unknown_0::ShaderImageLoadStoreBase::CreateComputeProgram
                         ((ShaderImageLoadStoreBase *)this,&local_88,false);
  }
  else {
    local_90 = 0;
    local_8c = 0;
    if (*(int *)(this + 0x30) != 0) goto LAB_00c64bb8;
    GenStoreShader<tcu::Vector<float,4>>
              (&local_88,(LoadStoreMachine *)0x0,internalformat,(GLenum)write_value,in_R8);
    expected_value_00 = (Vector<float,_4> *)0x0;
    local_8c = glcts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                         ((ShaderImageLoadStoreBase *)this,local_88._M_dataplus._M_p,
                          "\nvoid main() {\n  discard;\n}",false,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    GenLoadShader<tcu::Vector<float,4>>
              (&local_88,(LoadStoreMachine *)(ulong)*(uint *)(this + 0x30),internalformat,
               (GLenum)expected_value,expected_value_00);
    local_90 = glcts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                         ((ShaderImageLoadStoreBase *)this,local_88._M_dataplus._M_p,
                          "\nvoid main() {\n  discard;\n}",false,false);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
LAB_00c64bb8:
  this_00 = (CallLogWrapper *)(this + 8);
  glu::CallLogWrapper::glGenTextures(this_00,4,textures);
  pGVar4 = &DAT_01b0a9d0;
  lVar3 = 0;
  do {
    target = *pGVar4;
    glu::CallLogWrapper::glBindTexture(this_00,target,textures[lVar3]);
    glu::CallLogWrapper::glTexParameteri(this_00,target,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,target,0x2800,0x2600);
    glu::CallLogWrapper::glTexStorage2D(this_00,0xde1,1,internalformat,100,1);
    lVar3 = lVar3 + 1;
    pGVar4 = pGVar4 + 1;
  } while (lVar3 != 4);
  glu::CallLogWrapper::glBindImageTexture(this_00,1,textures[0],0,'\0',0,0x88b9,internalformat);
  glu::CallLogWrapper::glBindImageTexture(this_00,2,textures[1],0,'\x01',0,0x88b9,internalformat);
  glu::CallLogWrapper::glBindImageTexture(this_00,0,textures[2],0,'\x01',0,0x88b9,internalformat);
  glu::CallLogWrapper::glBindImageTexture(this_00,3,textures[3],0,'\x01',0,0x88b9,internalformat);
  __s = operator_new(0x640);
  memset(__s,0,0x640);
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,*(GLuint *)(this + 0x2c));
  glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x640,__s,0x88e4);
  glu::CallLogWrapper::glUseProgram(this_00,local_8c);
  glu::CallLogWrapper::glBindVertexArray(this_00,*(GLuint *)(this + 0x28));
  if (*(int *)(this + 0x30) == 0) {
    glu::CallLogWrapper::glDrawArrays(this_00,0,0,100);
  }
  else if (*(int *)(this + 0x30) == 4) {
    glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
  }
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
  glu::CallLogWrapper::glBindImageTexture(this_00,3,textures[0],0,'\0',0,35000,internalformat);
  glu::CallLogWrapper::glBindImageTexture(this_00,2,textures[1],0,'\x01',0,35000,internalformat);
  glu::CallLogWrapper::glBindImageTexture(this_00,1,textures[2],0,'\x01',0,35000,internalformat);
  glu::CallLogWrapper::glBindImageTexture(this_00,0,textures[3],0,'\x01',0,35000,internalformat);
  glu::CallLogWrapper::glUseProgram(this_00,local_90);
  if (*(int *)(this + 0x30) == 4) {
    glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
  }
  else if (*(int *)(this + 0x30) == 0) {
    glu::CallLogWrapper::glDrawArrays(this_00,0,0,100);
  }
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
  piVar1 = (int *)glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x640,1);
  bVar5 = true;
  uVar2 = 0;
  v = extraout_RDX;
  do {
    if ((((*piVar1 != 0) || (piVar1[1] != 1)) || (piVar1[2] != 0)) || (piVar1[3] != 1)) {
      uStack_48 = *(undefined8 *)piVar1;
      uStack_40 = *(undefined8 *)(piVar1 + 2);
      ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>
                (&local_88,(ShaderImageLoadStoreBase *)&uStack_48,v);
      glcts::anon_unknown_0::Output
                ("[%d] load/store operation check failed. (%s) \n",uVar2 & 0xffffffff,
                 local_88._M_dataplus._M_p);
      v = extraout_RDX_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        v = extraout_RDX_01;
      }
      bVar5 = false;
    }
    uVar2 = uVar2 + 1;
    piVar1 = piVar1 + 4;
  } while (uVar2 != 100);
  glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
  glu::CallLogWrapper::glUseProgram(this_00,0);
  glu::CallLogWrapper::glDeleteProgram(this_00,local_8c);
  glu::CallLogWrapper::glDeleteProgram(this_00,local_90);
  glu::CallLogWrapper::glDeleteTextures(this_00,4,textures);
  operator_delete(__s,0x640);
  return bVar5;
}

Assistant:

bool Write(GLenum internalformat, const T& write_value, const T& expected_value)
	{
		const GLenum targets[]	 = { GL_TEXTURE_2D, GL_TEXTURE_3D, GL_TEXTURE_CUBE_MAP, GL_TEXTURE_2D_ARRAY };
		const int	kTargets	  = sizeof(targets) / sizeof(targets[0]);
		const int	kSize		   = 100;
		GLuint		 program_store = 0;
		GLuint		 program_load  = 0;
		if (m_stage == 0)
		{ // VS
			const char* src_fs = NL "void main() {" NL "  discard;" NL "}";
			program_store	  = BuildProgram(GenStoreShader(m_stage, internalformat, write_value).c_str(), src_fs);
			program_load	   = BuildProgram(GenLoadShader(m_stage, internalformat, expected_value).c_str(), src_fs);
		}
		else if (m_stage == 4)
		{ // CS
			program_store = CreateComputeProgram(GenStoreShader(m_stage, internalformat, write_value));
			program_load  = CreateComputeProgram(GenLoadShader(m_stage, internalformat, expected_value));
		}
		GLuint textures[kTargets];
		glGenTextures(kTargets, textures);

		for (int i = 0; i < kTargets; ++i)
		{
			glBindTexture(targets[i], textures[i]);
			glTexParameteri(targets[i], GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(targets[i], GL_TEXTURE_MAG_FILTER, GL_NEAREST);

			if (targets[i] == GL_TEXTURE_2D)
			{
				glTexStorage2D(targets[i], 1, internalformat, kSize, 1);
			}
			else if (targets[i] == GL_TEXTURE_3D || targets[i] == GL_TEXTURE_2D_ARRAY)
			{
				glTexStorage3D(targets[i], 1, internalformat, kSize, 1, 2);
			}
			else if (targets[i] == GL_TEXTURE_CUBE_MAP)
			{
				glTexStorage2D(targets[i], 1, internalformat, kSize, kSize);
			}
		}
		glBindImageTexture(1, textures[0], 0, GL_FALSE, 0, GL_WRITE_ONLY, internalformat); // 2D
		glBindImageTexture(2, textures[1], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);  // 3D
		glBindImageTexture(0, textures[2], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);  // Cube
		glBindImageTexture(3, textures[3], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);  // 2DArray

		std::vector<ivec4> b_data(kSize);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, kSize * 4 * 4, &b_data[0], GL_STATIC_DRAW);

		glUseProgram(program_store);
		glBindVertexArray(m_vao);
		if (m_stage == 4)
		{ // CS
			glDispatchCompute(1, 1, 1);
		}
		else if (m_stage == 0)
		{ // VS
			glDrawArrays(GL_POINTS, 0, kSize);
		}
		bool status = true;
		glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);

		glBindImageTexture(3, textures[0], 0, GL_FALSE, 0, GL_READ_ONLY, internalformat); // 2D
		glBindImageTexture(2, textures[1], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);  // 3D
		glBindImageTexture(1, textures[2], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);  // Cube
		glBindImageTexture(0, textures[3], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);  // 2DArray

		glUseProgram(program_load);
		if (m_stage == 0)
		{ // VS
			glDrawArrays(GL_POINTS, 0, kSize);
		}
		else if (m_stage == 4)
		{ // CS
			glDispatchCompute(1, 1, 1);
		}
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		ivec4* out_data = (ivec4*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, kSize * 4 * 4, GL_MAP_READ_BIT);
		for (int i = 0; i < kSize; ++i)
		{
			if (!Equal(out_data[i], ivec4(0, 1, 0, 1), 0))
			{
				status = false;
				Output("[%d] load/store operation check failed. (%s) \n", i, ToString(out_data[i]).c_str());
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		glUseProgram(0);
		glDeleteProgram(program_store);
		glDeleteProgram(program_load);
		glDeleteTextures(kTargets, textures);
		return status;
	}